

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTrace.cpp
# Opt level: O2

void __thiscall
llbuild::core::BuildEngineTrace::finishedTask
          (BuildEngineTrace *this,Task *task,Rule *rule,bool wasChanged)

{
  FILE *__stream;
  char *pcVar1;
  char *pcVar2;
  iterator __it;
  undefined7 in_register_00000009;
  char *pcVar3;
  Task *local_38;
  
  __stream = (FILE *)this->outputPtr;
  local_38 = task;
  pcVar1 = getTaskName(this,task);
  pcVar2 = getRuleName(this,rule);
  pcVar3 = "unchanged";
  if ((int)CONCAT71(in_register_00000009,wasChanged) != 0) {
    pcVar3 = "changed";
  }
  fprintf(__stream,"{ \"finished-task\", \"%s\", \"%s\", \"%s\" },\n",pcVar1,pcVar2,pcVar3);
  __it = std::
         _Hashtable<const_llbuild::core::Task_*,_std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llbuild::core::Task_*>,_std::hash<const_llbuild::core::Task_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         ::find(&(this->taskNames)._M_h,&local_38);
  std::
  _Hashtable<const_llbuild::core::Task_*,_std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_llbuild::core::Task_*>,_std::hash<const_llbuild::core::Task_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::erase(&(this->taskNames)._M_h,
          (const_iterator)
          __it.
          super__Node_iterator_base<std::pair<const_llbuild::core::Task_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
          ._M_cur);
  return;
}

Assistant:

void BuildEngineTrace::finishedTask(const Task* task, const Rule* rule,
                                    bool wasChanged) {
  FILE *fp = static_cast<FILE*>(outputPtr);

  fprintf(fp, "{ \"finished-task\", \"%s\", \"%s\", \"%s\" },\n",
          getTaskName(task), getRuleName(rule),
          wasChanged ? "changed" : "unchanged");

  // Delete the task entry, as it could be reused.
  taskNames.erase(taskNames.find(task));
}